

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  long *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 h;
  ZSTD_longLengthType_e ZVar7;
  ZSTD_matchState_t *pZVar8;
  BYTE *pBVar9;
  long *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  undefined8 uVar13;
  char cVar14;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  long *plVar20;
  BYTE *pBVar21;
  byte bVar22;
  byte bVar23;
  ulong uVar24;
  BYTE *iStart;
  seqDef *psVar25;
  long *plVar26;
  long lVar27;
  long *plVar28;
  int iVar29;
  uint uVar30;
  int *piVar31;
  long lVar32;
  uint uVar33;
  long *plVar34;
  long *plVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  long *plVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  U32 UVar51;
  BYTE *pBVar52;
  long lVar53;
  uint local_12c;
  ulong local_c8;
  BYTE *litLimit_w;
  BYTE *litLimit_w_2;
  char *_ptr;
  ulong local_68;
  
  pZVar8 = ms->dictMatchState;
  if (pZVar8 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x724e,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar4 = (ms->cParams).targetLength;
  uVar24 = (ulong)(uVar4 + (uVar4 == 0));
  pBVar9 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar5;
  iEnd = (long *)((long)src + srcSize);
  plVar40 = (long *)((long)src + (srcSize - 8));
  uVar6 = (pZVar8->window).dictLimit;
  mEnd = (long *)(pZVar8->window).nextSrc;
  pBVar10 = (pZVar8->window).base;
  pBVar52 = pBVar10 + uVar6;
  uVar39 = (int)mEnd - (int)pBVar10;
  uVar33 = uVar5 - uVar39;
  iVar29 = ((int)src - (int)iStart) + (int)mEnd;
  iVar49 = (int)pBVar52;
  uVar30 = iVar29 - iVar49;
  uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar11 = pZVar8->hashTable;
  uVar47 = (pZVar8->cParams).hashLog;
  iVar36 = (int)pBVar9;
  uVar43 = ((int)iEnd - iVar36) - uVar5;
  uVar50 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  h = (ms->cParams).hashLog;
  local_12c = *rep;
  uVar46 = rep[1];
  uVar4 = uVar47 + 8;
  uVar15 = (ulong)uVar33;
  bVar22 = (byte)uVar47;
  cVar14 = (char)h;
  plVar26 = (long *)src;
  if (uVar50 == 5) {
    if (uVar41 < uVar43) goto LAB_0014e795;
    if (uVar5 < uVar39) goto LAB_0014e7b4;
    if (ms->prefetchCDictTables != 0) {
      for (uVar38 = 0; uVar38 < (ulong)(4L << (bVar22 & 0x3f)); uVar38 = uVar38 + 0x40) {
      }
    }
    if (local_12c <= uVar30) {
      if (uVar46 <= uVar30) {
        plVar34 = (long *)((long)src + (ulong)(iVar29 == iVar49));
        bVar23 = 0x40 - cVar14;
        plVar1 = iEnd + -4;
LAB_0014cc6e:
        if ((long *)((long)plVar26 + uVar24) <= plVar40) {
          if ((h < 0x21) && (uVar4 < 0x21)) {
            uVar18 = *plVar34 * -0x30e4432345000000;
            uVar45 = uVar18 >> (0x38 - bVar22 & 0x3f);
            uVar42 = (ulong)pUVar11[uVar45 >> 8];
            uVar45 = uVar45 ^ uVar42;
            plVar20 = plVar34 + 0x20;
            plVar35 = plVar34;
            plVar34 = (long *)((long)plVar26 + uVar24);
            uVar38 = uVar24;
LAB_0014cced:
            uVar37 = uVar18 >> (bVar23 & 0x3f);
            uVar47 = pUVar12[uVar37];
            UVar51 = (U32)((long)plVar35 - (long)pBVar9);
            uVar50 = (UVar51 - local_12c) + 1;
            uVar18 = *plVar34 * -0x30e4432345000000;
            uVar44 = uVar18 >> (0x38 - bVar22 & 0x3f);
            pUVar12[uVar37] = UVar51;
            if ((uVar5 - 1) - uVar50 < 3) {
LAB_0014cd71:
              if ((char)uVar45 == '\0') {
                uVar45 = uVar42 >> 8;
                uVar50 = (uint)(uVar42 >> 8);
                if (((uVar50 <= uVar6) || (*(int *)(pBVar10 + uVar45) != (int)*plVar35)) ||
                   (uVar5 < uVar47)) goto LAB_0014cd9c;
                uVar47 = UVar51 - (uVar50 + uVar33);
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar35 + 4),pBVar10 + uVar45 + 4,(BYTE *)iEnd,
                                    (BYTE *)mEnd,iStart);
                for (lVar53 = 0;
                    ((plVar34 = (long *)(lVar53 + (long)plVar35),
                     pBVar52 < pBVar10 + lVar53 + uVar45 && (plVar26 < plVar34)) &&
                    (*(BYTE *)((long)plVar35 + lVar53 + -1) == pBVar10[lVar53 + (uVar45 - 1)]));
                    lVar53 = lVar53 + -1) {
                }
                if (uVar47 == 0) goto LAB_0014e88d;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0014e69d;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
                lVar32 = (long)plVar35 - (long)plVar26;
                uVar38 = lVar32 + lVar53;
                plVar20 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38))
                goto LAB_0014e719;
                plVar28 = (long *)(uVar38 + (long)plVar26);
                if (iEnd < plVar28) goto LAB_0014e6fa;
                if (plVar1 < plVar28) goto LAB_0014d14c;
                lVar27 = plVar26[1];
                *plVar20 = *plVar26;
                plVar20[1] = lVar27;
                pBVar21 = seqStore->lit;
                if (uVar38 < 0x11) goto LAB_0014d266;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
                goto LAB_0014e86e;
                lVar27 = plVar26[3];
                *(long *)(pBVar21 + 0x10) = plVar26[2];
                *(long *)(pBVar21 + 0x18) = lVar27;
                if (0x20 < (long)uVar38) {
                  lVar27 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
                    uVar13 = puVar3[1];
                    pBVar2 = pBVar21 + lVar27 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar13;
                    puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
                    uVar13 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar21 + uVar38);
                }
                goto LAB_0014d170;
              }
LAB_0014cd9c:
              if ((uVar5 < uVar47) &&
                 (piVar31 = (int *)(pBVar9 + uVar47), *piVar31 == (int)*plVar35)) goto LAB_0014ced4;
              uVar38 = (uVar38 + 1) - (ulong)(plVar34 < plVar20);
              if (plVar40 < (long *)((long)plVar34 + uVar38)) goto LAB_0014e671;
              plVar20 = plVar20 + (ulong)(plVar20 <= plVar34) * 0x20;
              uVar42 = (ulong)pUVar11[uVar44 >> 8];
              uVar45 = uVar44 ^ uVar42;
              plVar35 = plVar34;
              plVar34 = (long *)((long)plVar34 + uVar38);
              goto LAB_0014cced;
            }
            piVar31 = (int *)(pBVar9 + uVar50);
            if (uVar50 < uVar5) {
              piVar31 = (int *)(pBVar10 + (uVar50 - uVar33));
            }
            if (*piVar31 != *(int *)((long)plVar35 + 1)) goto LAB_0014cd71;
            plVar34 = iEnd;
            if (uVar50 < uVar5) {
              plVar34 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar34,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0014e69d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
            plVar34 = (long *)((long)plVar35 + 1);
            uVar18 = (long)plVar34 - (long)plVar26;
            plVar20 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar18))
            goto LAB_0014e719;
            if (iEnd < plVar34) goto LAB_0014e6fa;
            if (plVar1 < plVar34) {
              ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar1);
              goto LAB_0014ce97;
            }
            lVar53 = plVar26[1];
            *plVar20 = *plVar26;
            plVar20[1] = lVar53;
            pBVar21 = seqStore->lit;
            if (uVar18 < 0x11) {
              seqStore->lit = pBVar21 + uVar18;
              goto LAB_0014d1bb;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2)))
               ) goto LAB_0014e86e;
            lVar53 = plVar26[3];
            *(long *)(pBVar21 + 0x10) = plVar26[2];
            *(long *)(pBVar21 + 0x18) = lVar53;
            if (0x20 < (long)uVar18) {
              lVar53 = 0;
              do {
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x20);
                uVar13 = puVar3[1];
                pBVar2 = pBVar21 + lVar53 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                lVar53 = lVar53 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21 + uVar18);
            }
LAB_0014ce97:
            seqStore->lit = seqStore->lit + uVar18;
            if (0xffff < uVar18) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_0014d1bb:
            uVar38 = sVar19 + 4;
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar18;
            psVar25->offBase = 1;
            if (2 < uVar38) {
              uVar18 = sVar19 + 1;
              uVar47 = local_12c;
              if (uVar18 < 0x10000) goto LAB_0014d2dd;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014d2b9;
              goto LAB_0014e757;
            }
            goto LAB_0014e6bc;
          }
          goto LAB_0014e738;
        }
        goto LAB_0014e671;
      }
      goto LAB_0014e7f2;
    }
  }
  else if (uVar50 == 6) {
    if (uVar41 < uVar43) goto LAB_0014e795;
    if (uVar5 < uVar39) goto LAB_0014e7b4;
    if (ms->prefetchCDictTables != 0) {
      for (uVar38 = 0; uVar38 < (ulong)(4L << (bVar22 & 0x3f)); uVar38 = uVar38 + 0x40) {
      }
    }
    if (local_12c <= uVar30) {
      if (uVar46 <= uVar30) {
        plVar34 = (long *)((long)src + (ulong)(iVar29 == iVar49));
        plVar1 = iEnd + -4;
LAB_0014c25f:
        uVar47 = local_12c;
        if ((long *)((long)plVar26 + uVar24) <= plVar40) {
          if ((0x20 < h) || (sVar19 = ZSTD_hash6Ptr(plVar34,h), 0x20 < uVar4)) goto LAB_0014e738;
          sVar16 = ZSTD_hash6Ptr(plVar34,uVar4);
          local_68 = (ulong)pUVar11[sVar16 >> 8];
          local_c8 = sVar16 ^ local_68;
          litLimit_w_2 = (BYTE *)(plVar34 + 0x20);
          plVar20 = plVar34;
          plVar34 = (long *)((long)plVar26 + uVar24);
          uVar38 = uVar24;
LAB_0014c2e8:
          uVar50 = pUVar12[sVar19];
          UVar51 = (U32)((long)plVar20 - (long)pBVar9);
          uVar30 = (UVar51 - local_12c) + 1;
          sVar16 = ZSTD_hash6Ptr(plVar34,h);
          sVar17 = ZSTD_hash6Ptr(plVar34,uVar4);
          pUVar12[sVar19] = UVar51;
          if ((uVar5 - 1) - uVar30 < 3) {
LAB_0014c380:
            if ((char)local_c8 == '\0') {
              uVar18 = local_68 >> 8;
              uVar30 = (uint)(local_68 >> 8);
              if (((uVar30 <= uVar6) || (*(int *)(pBVar10 + uVar18) != (int)*plVar20)) ||
                 (uVar5 < uVar50)) goto LAB_0014c3bd;
              uVar50 = UVar51 - (uVar30 + uVar33);
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar20 + 4),pBVar10 + uVar18 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              for (lVar53 = 0;
                  ((plVar34 = (long *)((long)plVar20 + lVar53), pBVar52 < pBVar10 + lVar53 + uVar18
                   && (plVar26 < plVar34)) &&
                  (*(BYTE *)((long)plVar20 + lVar53 + -1) == pBVar10[lVar53 + (uVar18 - 1)]));
                  lVar53 = lVar53 + -1) {
              }
              if (uVar50 == 0) goto LAB_0014e88d;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0014e69d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
              uVar38 = (long)plVar20 + (lVar53 - (long)plVar26);
              plVar35 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar38))
              goto LAB_0014e719;
              plVar28 = (long *)(uVar38 + (long)plVar26);
              if (iEnd < plVar28) goto LAB_0014e6fa;
              if (plVar1 < plVar28) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar35,(BYTE *)plVar26,(BYTE *)plVar28,(BYTE *)plVar1);
LAB_0014c817:
                seqStore->lit = seqStore->lit + (long)plVar20 + (lVar53 - (long)plVar26);
                if (0xffff < uVar38) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
                  seqStore->longLengthType = ZSTD_llt_literalLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                lVar32 = plVar26[1];
                *plVar35 = *plVar26;
                plVar35[1] = lVar32;
                pBVar21 = seqStore->lit;
                if (0x10 < uVar38) {
                  if (0xffffffffffffffe0 <
                      (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
                  goto LAB_0014e86e;
                  lVar32 = plVar26[3];
                  *(long *)(pBVar21 + 0x10) = plVar26[2];
                  *(long *)(pBVar21 + 0x18) = lVar32;
                  if (0x20 < (long)uVar38) {
                    lVar32 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)plVar26 + lVar32 + 0x20);
                      uVar13 = puVar3[1];
                      pBVar2 = pBVar21 + lVar32 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar13;
                      puVar3 = (undefined8 *)((long)plVar26 + lVar32 + 0x30);
                      uVar13 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                      lVar32 = lVar32 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar38);
                  }
                  goto LAB_0014c817;
                }
                seqStore->lit = pBVar21 + uVar38;
              }
              uVar38 = (sVar19 - lVar53) + 4;
              psVar25 = seqStore->sequences;
              psVar25->litLength = (short)lVar53 + ((short)plVar20 - (short)plVar26);
              psVar25->offBase = uVar50 + 3;
              if (uVar38 < 3) goto LAB_0014e6bc;
              uVar18 = (sVar19 - lVar53) + 1;
              uVar46 = local_12c;
              local_12c = uVar50;
              if (0xffff < uVar18) {
                ZVar7 = seqStore->longLengthType;
                goto LAB_0014c9c3;
              }
              goto LAB_0014c9e5;
            }
LAB_0014c3bd:
            if ((uVar50 <= uVar5) || (piVar31 = (int *)(pBVar9 + uVar50), *piVar31 != (int)*plVar20)
               ) {
              uVar38 = (uVar38 + 1) - (ulong)(plVar34 < litLimit_w_2);
              if ((long *)(uVar38 + (long)plVar34) <= plVar40) goto code_r0x0014c3f3;
              goto LAB_0014e671;
            }
            uVar50 = (int)plVar20 - (int)piVar31;
            sVar19 = ZSTD_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar31 + 1),(BYTE *)iEnd);
            for (lVar53 = 0;
                ((plVar34 = (long *)((long)plVar20 + lVar53),
                 iStart < (BYTE *)((long)piVar31 + lVar53) && (plVar26 < plVar34)) &&
                (*(char *)((long)plVar20 + lVar53 + -1) == *(char *)((long)piVar31 + lVar53 + -1)));
                lVar53 = lVar53 + -1) {
            }
            if (uVar50 == 0) goto LAB_0014e830;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0014e69d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
            uVar38 = (long)plVar20 + (lVar53 - (long)plVar26);
            plVar35 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar38))
            goto LAB_0014e719;
            plVar28 = (long *)(uVar38 + (long)plVar26);
            if (iEnd < plVar28) goto LAB_0014e6fa;
            if (plVar1 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)plVar26,(BYTE *)plVar28,(BYTE *)plVar1);
LAB_0014c5f1:
              seqStore->lit = seqStore->lit + (long)plVar20 + (lVar53 - (long)plVar26);
              if (0xffff < uVar38) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
            }
            else {
              lVar32 = plVar26[1];
              *plVar35 = *plVar26;
              plVar35[1] = lVar32;
              pBVar21 = seqStore->lit;
              if (0x10 < uVar38) {
                if ((ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))) <
                    0xffffffffffffffe1) {
                  lVar32 = plVar26[3];
                  *(long *)(pBVar21 + 0x10) = plVar26[2];
                  *(long *)(pBVar21 + 0x18) = lVar32;
                  if (0x20 < (long)uVar38) {
                    lVar32 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)plVar26 + lVar32 + 0x20);
                      uVar13 = puVar3[1];
                      pBVar2 = pBVar21 + lVar32 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar13;
                      puVar3 = (undefined8 *)((long)plVar26 + lVar32 + 0x30);
                      uVar13 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                      lVar32 = lVar32 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar38);
                  }
                  goto LAB_0014c5f1;
                }
                goto LAB_0014e86e;
              }
              seqStore->lit = pBVar21 + uVar38;
            }
            uVar38 = (sVar19 - lVar53) + 4;
            psVar25 = seqStore->sequences;
            psVar25->litLength = (short)lVar53 + ((short)plVar20 - (short)plVar26);
            psVar25->offBase = uVar50 + 3;
            if (uVar38 < 3) goto LAB_0014e6bc;
            uVar18 = (sVar19 - lVar53) + 1;
            uVar46 = local_12c;
            local_12c = uVar50;
            if (0xffff < uVar18) {
              ZVar7 = seqStore->longLengthType;
LAB_0014c9c3:
              uVar46 = uVar47;
              if (ZVar7 != ZSTD_llt_none) goto LAB_0014e757;
LAB_0014c9cc:
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            piVar31 = (int *)(pBVar9 + uVar30);
            if (uVar30 < uVar5) {
              piVar31 = (int *)(pBVar10 + (uVar30 - uVar33));
            }
            if (*piVar31 != *(int *)((long)plVar20 + 1)) goto LAB_0014c380;
            plVar34 = iEnd;
            if (uVar30 < uVar5) {
              plVar34 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar20 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar34,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0014e69d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
            plVar34 = (long *)((long)plVar20 + 1);
            uVar18 = (long)plVar34 - (long)plVar26;
            plVar35 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar18))
            goto LAB_0014e719;
            if (iEnd < plVar34) goto LAB_0014e6fa;
            if (plVar1 < plVar34) {
              ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar1);
              goto LAB_0014c4e2;
            }
            lVar53 = plVar26[1];
            *plVar35 = *plVar26;
            plVar35[1] = lVar53;
            pBVar21 = seqStore->lit;
            if (uVar18 < 0x11) {
              seqStore->lit = pBVar21 + uVar18;
              goto LAB_0014c867;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2)))
               ) goto LAB_0014e86e;
            lVar53 = plVar26[3];
            *(long *)(pBVar21 + 0x10) = plVar26[2];
            *(long *)(pBVar21 + 0x18) = lVar53;
            if (0x20 < (long)uVar18) {
              lVar53 = 0;
              do {
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x20);
                uVar13 = puVar3[1];
                pBVar2 = pBVar21 + lVar53 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                lVar53 = lVar53 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21 + uVar18);
            }
LAB_0014c4e2:
            seqStore->lit = seqStore->lit + uVar18;
            if (0xffff < uVar18) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_0014c867:
            uVar38 = sVar19 + 4;
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar18;
            psVar25->offBase = 1;
            if (uVar38 < 3) goto LAB_0014e6bc;
            uVar18 = sVar19 + 1;
            if (0xffff < uVar18) {
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014c9cc;
              goto LAB_0014e757;
            }
          }
LAB_0014c9e5:
          plVar34 = (long *)(uVar38 + (long)plVar34);
          psVar25->mlBase = (U16)uVar18;
          seqStore->sequences = psVar25 + 1;
          plVar26 = plVar34;
          if (plVar34 <= plVar40) {
            if (pBVar9 + ((long)plVar20 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0014e811;
            sVar19 = ZSTD_hash6Ptr(pBVar9 + ((long)plVar20 - (long)pBVar9 & 0xffffffffU) + 2,h);
            pUVar12[sVar19] = UVar51 + 2;
            sVar19 = ZSTD_hash6Ptr((void *)((long)plVar34 + -2),h);
            pUVar12[sVar19] = (int)(void *)((long)plVar34 + -2) - iVar36;
            uVar47 = uVar46;
            for (; uVar46 = uVar47, plVar26 = plVar34, plVar34 <= plVar40;
                plVar34 = (long *)((long)plVar34 + sVar19 + 4)) {
              UVar51 = (int)plVar34 - iVar36;
              uVar47 = UVar51 - uVar46;
              pBVar21 = pBVar9;
              if (uVar47 < uVar5) {
                pBVar21 = pBVar10 + -uVar15;
              }
              if (((uVar5 - 1) - uVar47 < 3) || (*(int *)(pBVar21 + uVar47) != (int)*plVar34))
              break;
              plVar26 = iEnd;
              if (uVar47 < uVar5) {
                plVar26 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)(pBVar21 + uVar47) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar26,iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0014e69d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
              plVar26 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar26) goto LAB_0014e719;
              if (iEnd < plVar34) goto LAB_0014e6fa;
              if (plVar1 < plVar34) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar34,(BYTE *)plVar1);
              }
              else {
                lVar53 = plVar34[1];
                *plVar26 = *plVar34;
                plVar26[1] = lVar53;
              }
              psVar25 = seqStore->sequences;
              psVar25->litLength = 0;
              psVar25->offBase = 1;
              if (sVar19 + 4 < 3) goto LAB_0014e6bc;
              if (0xffff < sVar19 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar25->mlBase = (U16)(sVar19 + 1);
              seqStore->sequences = psVar25 + 1;
              sVar16 = ZSTD_hash6Ptr(plVar34,h);
              pUVar12[sVar16] = UVar51;
              uVar47 = local_12c;
              local_12c = uVar46;
            }
          }
          goto LAB_0014c25f;
        }
LAB_0014e671:
        *rep = local_12c;
        rep[1] = uVar46;
        return (long)iEnd - (long)plVar26;
      }
      goto LAB_0014e7f2;
    }
  }
  else if (uVar50 == 7) {
    if (uVar41 < uVar43) {
LAB_0014e795:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a0,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar5 < uVar39) {
LAB_0014e7b4:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a7,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (ms->prefetchCDictTables != 0) {
      for (uVar38 = 0; uVar38 < (ulong)(4L << (bVar22 & 0x3f)); uVar38 = uVar38 + 0x40) {
      }
    }
    if (local_12c <= uVar30) {
      if (uVar46 <= uVar30) {
        plVar34 = (long *)((long)src + (ulong)(iVar29 == iVar49));
        bVar23 = 0x40 - cVar14;
        plVar1 = iEnd + -4;
LAB_0014d54d:
        if ((long *)((long)plVar26 + uVar24) <= plVar40) {
          if ((0x20 < h) || (0x20 < uVar4)) {
LAB_0014e738:
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          uVar18 = *plVar34 * -0x30e44323405a9d00;
          uVar45 = uVar18 >> (0x38 - bVar22 & 0x3f);
          uVar42 = (ulong)pUVar11[uVar45 >> 8];
          uVar45 = uVar45 ^ uVar42;
          plVar20 = plVar34 + 0x20;
          plVar35 = plVar34;
          plVar34 = (long *)((long)plVar26 + uVar24);
          uVar38 = uVar24;
LAB_0014d5c7:
          uVar37 = uVar18 >> (bVar23 & 0x3f);
          uVar47 = pUVar12[uVar37];
          UVar51 = (U32)((long)plVar35 - (long)pBVar9);
          uVar50 = (UVar51 - local_12c) + 1;
          uVar18 = *plVar34 * -0x30e44323405a9d00;
          uVar44 = uVar18 >> (0x38 - bVar22 & 0x3f);
          pUVar12[uVar37] = UVar51;
          if ((uVar5 - 1) - uVar50 < 3) {
LAB_0014d646:
            if ((char)uVar45 == '\0') {
              uVar45 = uVar42 >> 8;
              uVar50 = (uint)(uVar42 >> 8);
              if (((uVar50 <= uVar6) || (*(int *)(pBVar10 + uVar45) != (int)*plVar35)) ||
                 (uVar5 < uVar47)) goto LAB_0014d671;
              uVar47 = UVar51 - (uVar50 + uVar33);
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar35 + 4),pBVar10 + uVar45 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              for (lVar53 = 0;
                  ((plVar34 = (long *)(lVar53 + (long)plVar35), pBVar52 < pBVar10 + lVar53 + uVar45
                   && (plVar26 < plVar34)) &&
                  (*(BYTE *)((long)plVar35 + lVar53 + -1) == pBVar10[lVar53 + (uVar45 - 1)]));
                  lVar53 = lVar53 + -1) {
              }
              if (uVar47 == 0) {
LAB_0014e88d:
                __assert_fail("(offset)>0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x71ed,
                              "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                             );
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0014e69d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
              lVar32 = (long)plVar35 - (long)plVar26;
              uVar38 = lVar32 + lVar53;
              plVar20 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38))
              goto LAB_0014e719;
              plVar28 = (long *)(uVar38 + (long)plVar26);
              if (iEnd < plVar28) goto LAB_0014e6fa;
              if (plVar1 < plVar28) goto LAB_0014da21;
              lVar27 = plVar26[1];
              *plVar20 = *plVar26;
              plVar20[1] = lVar27;
              pBVar21 = seqStore->lit;
              if (uVar38 < 0x11) goto LAB_0014db3b;
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
              goto LAB_0014e86e;
              lVar27 = plVar26[3];
              *(long *)(pBVar21 + 0x10) = plVar26[2];
              *(long *)(pBVar21 + 0x18) = lVar27;
              if (0x20 < (long)uVar38) {
                lVar27 = 0;
                do {
                  puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
                  uVar13 = puVar3[1];
                  pBVar2 = pBVar21 + lVar27 + 0x20;
                  *(undefined8 *)pBVar2 = *puVar3;
                  *(undefined8 *)(pBVar2 + 8) = uVar13;
                  puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
                  uVar13 = puVar3[1];
                  *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                  lVar27 = lVar27 + 0x20;
                } while (pBVar2 + 0x20 < pBVar21 + uVar38);
              }
              goto LAB_0014da45;
            }
LAB_0014d671:
            if ((uVar5 < uVar47) && (piVar31 = (int *)(pBVar9 + uVar47), *piVar31 == (int)*plVar35))
            goto LAB_0014d7a9;
            uVar38 = (uVar38 + 1) - (ulong)(plVar34 < plVar20);
            if (plVar40 < (long *)((long)plVar34 + uVar38)) goto LAB_0014e671;
            plVar20 = plVar20 + (ulong)(plVar20 <= plVar34) * 0x20;
            uVar42 = (ulong)pUVar11[uVar44 >> 8];
            uVar45 = uVar44 ^ uVar42;
            plVar35 = plVar34;
            plVar34 = (long *)((long)plVar34 + uVar38);
            goto LAB_0014d5c7;
          }
          piVar31 = (int *)(pBVar9 + uVar50);
          if (uVar50 < uVar5) {
            piVar31 = (int *)(pBVar10 + (uVar50 - uVar33));
          }
          if (*piVar31 != *(int *)((long)plVar35 + 1)) goto LAB_0014d646;
          plVar34 = iEnd;
          if (uVar50 < uVar5) {
            plVar34 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar35 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar34,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0014e69d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
          plVar34 = (long *)((long)plVar35 + 1);
          uVar18 = (long)plVar34 - (long)plVar26;
          plVar20 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar18))
          goto LAB_0014e719;
          if (iEnd < plVar34) goto LAB_0014e6fa;
          if (plVar1 < plVar34) {
            ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar1);
            goto LAB_0014d76c;
          }
          lVar53 = plVar26[1];
          *plVar20 = *plVar26;
          plVar20[1] = lVar53;
          pBVar21 = seqStore->lit;
          if (uVar18 < 0x11) {
            seqStore->lit = pBVar21 + uVar18;
            goto LAB_0014da90;
          }
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
          goto LAB_0014e86e;
          lVar53 = plVar26[3];
          *(long *)(pBVar21 + 0x10) = plVar26[2];
          *(long *)(pBVar21 + 0x18) = lVar53;
          if (0x20 < (long)uVar18) {
            lVar53 = 0;
            do {
              puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x20);
              uVar13 = puVar3[1];
              pBVar2 = pBVar21 + lVar53 + 0x20;
              *(undefined8 *)pBVar2 = *puVar3;
              *(undefined8 *)(pBVar2 + 8) = uVar13;
              puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x30);
              uVar13 = puVar3[1];
              *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar2 + 0x18) = uVar13;
              lVar53 = lVar53 + 0x20;
            } while (pBVar2 + 0x20 < pBVar21 + uVar18);
          }
LAB_0014d76c:
          seqStore->lit = seqStore->lit + uVar18;
          if (0xffff < uVar18) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0014e84f:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0014da90:
          uVar38 = sVar19 + 4;
          psVar25 = seqStore->sequences;
          psVar25->litLength = (U16)uVar18;
          psVar25->offBase = 1;
          if (uVar38 < 3) {
LAB_0014e6bc:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar18 = sVar19 + 1;
          uVar47 = local_12c;
          if (uVar18 < 0x10000) goto LAB_0014dbb2;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014db8e;
LAB_0014e757:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        goto LAB_0014e671;
      }
LAB_0014e7f2:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71b4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
  }
  else {
    if (uVar41 < uVar43) goto LAB_0014e795;
    if (uVar5 < uVar39) goto LAB_0014e7b4;
    if (ms->prefetchCDictTables != 0) {
      for (uVar38 = 0; uVar38 < (ulong)(4L << (bVar22 & 0x3f)); uVar38 = uVar38 + 0x40) {
      }
    }
    if (local_12c <= uVar30) {
      if (uVar46 <= uVar30) {
        plVar34 = (long *)((long)src + (ulong)(iVar29 == iVar49));
        bVar23 = 0x20 - cVar14;
        plVar1 = iEnd + -4;
LAB_0014de08:
        if ((long *)((long)plVar26 + uVar24) <= plVar40) {
          if ((h < 0x21) && (uVar4 < 0x21)) {
            uVar50 = (int)*plVar34 * -0x61c8864f;
            uVar30 = uVar50 >> (0x18 - bVar22 & 0x1f);
            uVar47 = pUVar11[uVar30 >> 8];
            uVar30 = uVar30 ^ uVar47;
            plVar20 = plVar34 + 0x20;
            plVar35 = plVar34;
            plVar34 = (long *)((long)plVar26 + uVar24);
            uVar38 = uVar24;
LAB_0014de7d:
            uVar41 = uVar50 >> (bVar23 & 0x1f);
            uVar39 = pUVar12[uVar41];
            UVar51 = (U32)((long)plVar35 - (long)pBVar9);
            uVar48 = (UVar51 - local_12c) + 1;
            uVar50 = (int)*plVar34 * -0x61c8864f;
            uVar43 = uVar50 >> (0x18 - bVar22 & 0x1f);
            pUVar12[uVar41] = UVar51;
            if ((uVar5 - 1) - uVar48 < 3) {
LAB_0014def3:
              if ((char)uVar30 == '\0') {
                uVar47 = uVar47 >> 8;
                uVar18 = (ulong)uVar47;
                if (((uVar47 <= uVar6) || (*(int *)(pBVar10 + uVar18) != (int)*plVar35)) ||
                   (uVar5 < uVar39)) goto LAB_0014df1f;
                uVar47 = UVar51 - (uVar47 + uVar33);
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar35 + 4),pBVar10 + uVar18 + 4,(BYTE *)iEnd,
                                    (BYTE *)mEnd,iStart);
                for (lVar53 = 0;
                    ((plVar34 = (long *)(lVar53 + (long)plVar35),
                     pBVar52 < pBVar10 + lVar53 + uVar18 && (plVar26 < plVar34)) &&
                    (*(BYTE *)((long)plVar35 + lVar53 + -1) == pBVar10[lVar53 + (uVar18 - 1)]));
                    lVar53 = lVar53 + -1) {
                }
                if (uVar47 == 0) goto LAB_0014e88d;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0014e69d;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
                lVar32 = (long)plVar35 - (long)plVar26;
                uVar38 = lVar32 + lVar53;
                plVar20 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38))
                goto LAB_0014e719;
                plVar28 = (long *)(uVar38 + (long)plVar26);
                if (iEnd < plVar28) goto LAB_0014e6fa;
                if (plVar1 < plVar28) goto LAB_0014e2ec;
                lVar27 = plVar26[1];
                *plVar20 = *plVar26;
                plVar20[1] = lVar27;
                pBVar21 = seqStore->lit;
                if (uVar38 < 0x11) goto LAB_0014e404;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
                goto LAB_0014e86e;
                lVar27 = plVar26[3];
                *(long *)(pBVar21 + 0x10) = plVar26[2];
                *(long *)(pBVar21 + 0x18) = lVar27;
                if (0x20 < (long)uVar38) {
                  lVar27 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
                    uVar13 = puVar3[1];
                    pBVar2 = pBVar21 + lVar27 + 0x20;
                    *(undefined8 *)pBVar2 = *puVar3;
                    *(undefined8 *)(pBVar2 + 8) = uVar13;
                    puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
                    uVar13 = puVar3[1];
                    *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                    lVar27 = lVar27 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar21 + uVar38);
                }
                goto LAB_0014e308;
              }
LAB_0014df1f:
              if ((uVar5 < uVar39) &&
                 (piVar31 = (int *)(pBVar9 + uVar39), *piVar31 == (int)*plVar35)) goto LAB_0014e050;
              uVar38 = (uVar38 + 1) - (ulong)(plVar34 < plVar20);
              if (plVar40 < (long *)((long)plVar34 + uVar38)) goto LAB_0014e671;
              plVar20 = plVar20 + (ulong)(plVar20 <= plVar34) * 0x20;
              uVar47 = pUVar11[uVar43 >> 8];
              uVar30 = uVar43 ^ uVar47;
              plVar35 = plVar34;
              plVar34 = (long *)((long)plVar34 + uVar38);
              goto LAB_0014de7d;
            }
            piVar31 = (int *)(pBVar9 + uVar48);
            if (uVar48 < uVar5) {
              piVar31 = (int *)(pBVar10 + (uVar48 - uVar33));
            }
            if (*piVar31 != *(int *)((long)plVar35 + 1)) goto LAB_0014def3;
            plVar34 = iEnd;
            if (uVar48 < uVar5) {
              plVar34 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar34,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0014e69d;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
            plVar34 = (long *)((long)plVar35 + 1);
            uVar18 = (long)plVar34 - (long)plVar26;
            plVar20 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar18))
            goto LAB_0014e719;
            if (iEnd < plVar34) goto LAB_0014e6fa;
            if (plVar1 < plVar34) {
              ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar1);
              goto LAB_0014e013;
            }
            lVar53 = plVar26[1];
            *plVar20 = *plVar26;
            plVar20[1] = lVar53;
            pBVar21 = seqStore->lit;
            if (uVar18 < 0x11) {
              seqStore->lit = pBVar21 + uVar18;
              goto LAB_0014e353;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2)))
               ) goto LAB_0014e86e;
            lVar53 = plVar26[3];
            *(long *)(pBVar21 + 0x10) = plVar26[2];
            *(long *)(pBVar21 + 0x18) = lVar53;
            if (0x20 < (long)uVar18) {
              lVar53 = 0;
              do {
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x20);
                uVar13 = puVar3[1];
                pBVar2 = pBVar21 + lVar53 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)plVar26 + lVar53 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar13;
                lVar53 = lVar53 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21 + uVar18);
            }
LAB_0014e013:
            seqStore->lit = seqStore->lit + uVar18;
            if (0xffff < uVar18) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_0014e353:
            uVar38 = sVar19 + 4;
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar18;
            psVar25->offBase = 1;
            if (2 < uVar38) {
              uVar18 = sVar19 + 1;
              uVar47 = local_12c;
              if (uVar18 < 0x10000) goto LAB_0014e47a;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014e455;
              goto LAB_0014e757;
            }
            goto LAB_0014e6bc;
          }
          goto LAB_0014e738;
        }
        goto LAB_0014e671;
      }
      goto LAB_0014e7f2;
    }
  }
  __assert_fail("offset_1 <= dictAndPrefixLength",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x71b3,
                "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
               );
LAB_0014ced4:
  uVar47 = (int)plVar35 - (int)piVar31;
  sVar19 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)(piVar31 + 1),(BYTE *)iEnd);
  for (lVar53 = 0;
      ((plVar34 = (long *)(lVar53 + (long)plVar35), iStart < (BYTE *)((long)piVar31 + lVar53) &&
       (plVar26 < plVar34)) &&
      (*(char *)((long)plVar35 + lVar53 + -1) == *(char *)((long)piVar31 + lVar53 + -1)));
      lVar53 = lVar53 + -1) {
  }
  if (uVar47 == 0) goto LAB_0014e830;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014e69d;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
  lVar32 = (long)plVar35 - (long)plVar26;
  uVar38 = lVar32 + lVar53;
  plVar20 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38)) goto LAB_0014e719;
  plVar28 = (long *)(uVar38 + (long)plVar26);
  if (iEnd < plVar28) goto LAB_0014e6fa;
  if (plVar1 < plVar28) {
LAB_0014d14c:
    ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar28,(BYTE *)plVar1);
  }
  else {
    lVar27 = plVar26[1];
    *plVar20 = *plVar26;
    plVar20[1] = lVar27;
    pBVar21 = seqStore->lit;
    if (uVar38 < 0x11) {
LAB_0014d266:
      seqStore->lit = pBVar21 + uVar38;
      goto LAB_0014d26d;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
    goto LAB_0014e86e;
    lVar27 = plVar26[3];
    *(long *)(pBVar21 + 0x10) = plVar26[2];
    *(long *)(pBVar21 + 0x18) = lVar27;
    if (0x20 < (long)uVar38) {
      lVar27 = 0;
      do {
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
        uVar13 = puVar3[1];
        pBVar2 = pBVar21 + lVar27 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar13;
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
        uVar13 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar13;
        lVar27 = lVar27 + 0x20;
      } while (pBVar2 + 0x20 < pBVar21 + uVar38);
    }
  }
LAB_0014d170:
  seqStore->lit = seqStore->lit + lVar53 + lVar32;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014d26d:
  uVar38 = (sVar19 - lVar53) + 4;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (short)lVar53 + ((short)plVar35 - (short)plVar26);
  psVar25->offBase = uVar47 + 3;
  if (uVar38 < 3) goto LAB_0014e6bc;
  uVar18 = (sVar19 - lVar53) + 1;
  uVar46 = local_12c;
  if (0xffff < uVar18) {
    local_12c = uVar47;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
LAB_0014d2b9:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    uVar47 = local_12c;
  }
LAB_0014d2dd:
  local_12c = uVar47;
  plVar34 = (long *)(uVar38 + (long)plVar34);
  psVar25->mlBase = (U16)uVar18;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  plVar26 = plVar34;
  if (plVar34 <= plVar40) {
    if (pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0014e811;
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar51 + 2;
    pUVar12[(ulong)(*(long *)((long)plVar34 + -2) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
         ((int)plVar34 + -2) - iVar36;
    uVar47 = uVar46;
    for (; uVar46 = uVar47, plVar26 = plVar34, plVar34 <= plVar40;
        plVar34 = (long *)((long)plVar34 + sVar19 + 4)) {
      UVar51 = (int)plVar34 - iVar36;
      uVar47 = UVar51 - uVar46;
      pBVar21 = pBVar9;
      if (uVar47 < uVar5) {
        pBVar21 = pBVar10 + -uVar15;
      }
      if (((uVar5 - 1) - uVar47 < 3) || (*(int *)(pBVar21 + uVar47) != (int)*plVar34)) break;
      plVar26 = iEnd;
      if (uVar47 < uVar5) {
        plVar26 = mEnd;
      }
      sVar19 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)(pBVar21 + uVar47) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar26,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014e69d;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
      plVar26 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar26) goto LAB_0014e719;
      if (iEnd < plVar34) goto LAB_0014e6fa;
      if (plVar1 < plVar34) {
        ZSTD_safecopyLiterals((BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar34,(BYTE *)plVar1);
      }
      else {
        lVar53 = plVar34[1];
        *plVar26 = *plVar34;
        plVar26[1] = lVar53;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (sVar19 + 4 < 3) goto LAB_0014e6bc;
      if (0xffff < sVar19 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar19 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      pUVar12[(ulong)(*plVar34 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar51;
      uVar47 = local_12c;
      local_12c = uVar46;
    }
  }
  goto LAB_0014cc6e;
code_r0x0014c3f3:
  litLimit_w_2 = litLimit_w_2 + (ulong)(litLimit_w_2 <= plVar34) * 0x100;
  local_68 = (ulong)pUVar11[sVar17 >> 8];
  local_c8 = sVar17 ^ local_68;
  plVar20 = plVar34;
  plVar34 = (long *)(uVar38 + (long)plVar34);
  sVar19 = sVar16;
  goto LAB_0014c2e8;
LAB_0014e050:
  uVar47 = (int)plVar35 - (int)piVar31;
  sVar19 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)(piVar31 + 1),(BYTE *)iEnd);
  for (lVar53 = 0;
      ((plVar34 = (long *)(lVar53 + (long)plVar35), iStart < (BYTE *)((long)piVar31 + lVar53) &&
       (plVar26 < plVar34)) &&
      (*(char *)((long)plVar35 + lVar53 + -1) == *(char *)((long)piVar31 + lVar53 + -1)));
      lVar53 = lVar53 + -1) {
  }
  if (uVar47 == 0) goto LAB_0014e830;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014e69d;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
  lVar32 = (long)plVar35 - (long)plVar26;
  uVar38 = lVar32 + lVar53;
  plVar20 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38)) goto LAB_0014e719;
  plVar28 = (long *)(uVar38 + (long)plVar26);
  if (iEnd < plVar28) goto LAB_0014e6fa;
  if (plVar1 < plVar28) {
LAB_0014e2ec:
    ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar28,(BYTE *)plVar1);
  }
  else {
    lVar27 = plVar26[1];
    *plVar20 = *plVar26;
    plVar20[1] = lVar27;
    pBVar21 = seqStore->lit;
    if (uVar38 < 0x11) {
LAB_0014e404:
      seqStore->lit = pBVar21 + uVar38;
      goto LAB_0014e40b;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2))))
    goto LAB_0014e86e;
    lVar27 = plVar26[3];
    *(long *)(pBVar21 + 0x10) = plVar26[2];
    *(long *)(pBVar21 + 0x18) = lVar27;
    if (0x20 < (long)uVar38) {
      lVar27 = 0;
      do {
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
        uVar13 = puVar3[1];
        pBVar2 = pBVar21 + lVar27 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar13;
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
        uVar13 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar13;
        lVar27 = lVar27 + 0x20;
      } while (pBVar2 + 0x20 < pBVar21 + uVar38);
    }
  }
LAB_0014e308:
  seqStore->lit = seqStore->lit + lVar53 + lVar32;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014e40b:
  uVar38 = (sVar19 - lVar53) + 4;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (short)lVar53 + ((short)plVar35 - (short)plVar26);
  psVar25->offBase = uVar47 + 3;
  if (uVar38 < 3) goto LAB_0014e6bc;
  uVar18 = (sVar19 - lVar53) + 1;
  uVar46 = local_12c;
  if (0xffff < uVar18) {
    local_12c = uVar47;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
LAB_0014e455:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    uVar47 = local_12c;
  }
LAB_0014e47a:
  local_12c = uVar47;
  plVar34 = (long *)(uVar38 + (long)plVar34);
  psVar25->mlBase = (U16)uVar18;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  plVar26 = plVar34;
  if (plVar34 <= plVar40) {
    if (pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0014e811;
    pUVar12[(uint)(*(int *)(pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2) * -0x61c8864f
                  ) >> (bVar23 & 0x1f)] = UVar51 + 2;
    pUVar12[(uint)(*(int *)((long)plVar34 + -2) * -0x61c8864f) >> (bVar23 & 0x1f)] =
         ((int)plVar34 + -2) - iVar36;
    uVar47 = uVar46;
    for (; uVar46 = uVar47, plVar26 = plVar34, plVar34 <= plVar40;
        plVar34 = (long *)((long)plVar34 + sVar19 + 4)) {
      UVar51 = (int)plVar34 - iVar36;
      uVar47 = UVar51 - uVar46;
      pBVar21 = pBVar9;
      if (uVar47 < uVar5) {
        pBVar21 = pBVar10 + -uVar15;
      }
      if (((uVar5 - 1) - uVar47 < 3) || (*(int *)(pBVar21 + uVar47) != (int)*plVar34)) break;
      plVar26 = iEnd;
      if (uVar47 < uVar5) {
        plVar26 = mEnd;
      }
      sVar19 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)(pBVar21 + uVar47) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar26,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014e69d;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
      plVar26 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar26) goto LAB_0014e719;
      if (iEnd < plVar34) goto LAB_0014e6fa;
      if (plVar1 < plVar34) {
        ZSTD_safecopyLiterals((BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar34,(BYTE *)plVar1);
      }
      else {
        lVar53 = plVar34[1];
        *plVar26 = *plVar34;
        plVar26[1] = lVar53;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (sVar19 + 4 < 3) goto LAB_0014e6bc;
      if (0xffff < sVar19 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar19 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      pUVar12[(uint)((int)*plVar34 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar51;
      uVar47 = local_12c;
      local_12c = uVar46;
    }
  }
  goto LAB_0014de08;
LAB_0014d7a9:
  uVar47 = (int)plVar35 - (int)piVar31;
  sVar19 = ZSTD_count((BYTE *)((long)plVar35 + 4),(BYTE *)(piVar31 + 1),(BYTE *)iEnd);
  for (lVar53 = 0;
      ((plVar34 = (long *)(lVar53 + (long)plVar35), iStart < (BYTE *)((long)piVar31 + lVar53) &&
       (plVar26 < plVar34)) &&
      (*(char *)((long)plVar35 + lVar53 + -1) == *(char *)((long)piVar31 + lVar53 + -1)));
      lVar53 = lVar53 + -1) {
  }
  if (uVar47 == 0) {
LAB_0014e830:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x71ff,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_0014e69d:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_0014e6db:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  lVar32 = (long)plVar35 - (long)plVar26;
  uVar38 = lVar32 + lVar53;
  plVar20 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar38)) {
LAB_0014e719:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468e,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  plVar28 = (long *)(uVar38 + (long)plVar26);
  if (iEnd < plVar28) {
LAB_0014e6fa:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar1 < plVar28) {
LAB_0014da21:
    ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar26,(BYTE *)plVar28,(BYTE *)plVar1);
  }
  else {
    lVar27 = plVar26[1];
    *plVar20 = *plVar26;
    plVar20[1] = lVar27;
    pBVar21 = seqStore->lit;
    if (uVar38 < 0x11) {
LAB_0014db3b:
      seqStore->lit = pBVar21 + uVar38;
      goto LAB_0014db42;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - (long)(plVar26 + 2)))) {
LAB_0014e86e:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x36a6,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar27 = plVar26[3];
    *(long *)(pBVar21 + 0x10) = plVar26[2];
    *(long *)(pBVar21 + 0x18) = lVar27;
    if (0x20 < (long)uVar38) {
      lVar27 = 0;
      do {
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x20);
        uVar13 = puVar3[1];
        pBVar2 = pBVar21 + lVar27 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar13;
        puVar3 = (undefined8 *)((long)plVar26 + lVar27 + 0x30);
        uVar13 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar13;
        lVar27 = lVar27 + 0x20;
      } while (pBVar2 + 0x20 < pBVar21 + uVar38);
    }
  }
LAB_0014da45:
  seqStore->lit = seqStore->lit + lVar53 + lVar32;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e84f;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014db42:
  uVar38 = (sVar19 - lVar53) + 4;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (short)lVar53 + ((short)plVar35 - (short)plVar26);
  psVar25->offBase = uVar47 + 3;
  if (uVar38 < 3) goto LAB_0014e6bc;
  uVar18 = (sVar19 - lVar53) + 1;
  uVar46 = local_12c;
  if (0xffff < uVar18) {
    local_12c = uVar47;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
LAB_0014db8e:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
    uVar47 = local_12c;
  }
LAB_0014dbb2:
  local_12c = uVar47;
  plVar34 = (long *)(uVar38 + (long)plVar34);
  psVar25->mlBase = (U16)uVar18;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  plVar26 = plVar34;
  if (plVar34 <= plVar40) {
    if (pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2 <= src) {
LAB_0014e811:
      __assert_fail("base+curr+2 > istart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x721b,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)plVar35 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar51 + 2;
    pUVar12[(ulong)(*(long *)((long)plVar34 + -2) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
         ((int)plVar34 + -2) - iVar36;
    uVar47 = uVar46;
    for (; uVar46 = uVar47, plVar26 = plVar34, plVar34 <= plVar40;
        plVar34 = (long *)((long)plVar34 + sVar19 + 4)) {
      UVar51 = (int)plVar34 - iVar36;
      uVar47 = UVar51 - uVar46;
      pBVar21 = pBVar9;
      if (uVar47 < uVar5) {
        pBVar21 = pBVar10 + -uVar15;
      }
      if (((uVar5 - 1) - uVar47 < 3) || (*(int *)(pBVar21 + uVar47) != (int)*plVar34)) break;
      plVar26 = iEnd;
      if (uVar47 < uVar5) {
        plVar26 = mEnd;
      }
      sVar19 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)(pBVar21 + uVar47) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar26,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014e69d;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014e6db;
      plVar26 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar26) goto LAB_0014e719;
      if (iEnd < plVar34) goto LAB_0014e6fa;
      if (plVar1 < plVar34) {
        ZSTD_safecopyLiterals((BYTE *)plVar26,(BYTE *)plVar34,(BYTE *)plVar34,(BYTE *)plVar1);
      }
      else {
        lVar53 = plVar34[1];
        *plVar26 = *plVar34;
        plVar26[1] = lVar53;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offBase = 1;
      if (sVar19 + 4 < 3) goto LAB_0014e6bc;
      if (0xffff < sVar19 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014e757;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->mlBase = (U16)(sVar19 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      pUVar12[(ulong)(*plVar34 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar51;
      uVar47 = local_12c;
      local_12c = uVar46;
    }
  }
  goto LAB_0014d54d;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}